

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

void __thiscall
HMatrix::setup_lgBs(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_)

{
  reference pvVar1;
  reference pvVar2;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int iPut;
  int iRow;
  int k_1;
  int iCol;
  int i_1;
  int i;
  int k;
  int AcountX;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  double *in_stack_ffffffffffffff88;
  value_type vVar4;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  undefined4 in_stack_ffffffffffffff94;
  value_type vVar6;
  value_type in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  std::vector<int,std::allocator<int>>::assign<int_const*,void>
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (int *)in_stack_ffffffffffffff88,
             (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  iVar5 = *(int *)(in_RCX + (long)in_ESI * 4);
  std::vector<int,std::allocator<int>>::assign<int_const*,void>
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (int *)in_stack_ffffffffffffff88,
             (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,(double *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
             ,(value_type *)0x16f8f8);
  for (local_34 = 0; local_34 < iVar5; local_34 = local_34 + 1) {
    in_stack_ffffffffffffffa0 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_34);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,(long)*pvVar1
                       );
    *pvVar1 = *pvVar1 + 1;
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),0);
  *pvVar1 = 0;
  for (local_38 = 1; local_38 <= in_RDI[1]; local_38 = local_38 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)(local_38 + -1));
    in_stack_ffffffffffffff98 = *pvVar1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)(local_38 + -1));
    in_stack_ffffffffffffff9c = in_stack_ffffffffffffff98 + *pvVar1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)local_38);
    *pvVar1 = in_stack_ffffffffffffff9c;
  }
  for (local_3c = 0; local_3c < in_RDI[1]; local_3c = local_3c + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)local_3c);
    vVar6 = *pvVar1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_3c);
    *pvVar1 = vVar6;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  for (local_40 = 0; local_40 < *in_RDI; local_40 = local_40 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_40);
    local_44 = *pvVar1;
    while( true ) {
      iVar5 = local_44;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_40 + 1));
      if (*pvVar1 <= iVar5) break;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_44);
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)*pvVar1);
      iVar5 = *pvVar1;
      *pvVar1 = iVar5 + 1;
      iVar3 = local_40;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar5);
      *pvVar1 = iVar3;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_44);
      vVar4 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),(long)iVar5);
      *pvVar2 = vVar4;
      local_44 = local_44 + 1;
    }
  }
  return;
}

Assistant:

void HMatrix::setup_lgBs(int numCol_, int numRow_, const int *Astart_,
			 const int *Aindex_, const double *Avalue_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a logical basis
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);
  
  // Build row copy - pointers
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  for (int k = 0; k < AcountX; k++)
    AR_Nend[Aindex[k]]++;
  ARstart[0] = 0;
  for (int i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + AR_Nend[i - 1];
  for (int i = 0; i < numRow; i++)
    AR_Nend[i] = ARstart[i];
  
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      int iRow = Aindex[k];
      int iPut = AR_Nend[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}